

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O3

RPCHelpMan * createmultisig(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_05;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  RPCHelpMan *in_RDI;
  undefined8 uVar8;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_fffffffffffff048;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff04c;
  undefined1 *puVar11;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffff058;
  undefined8 in_stack_fffffffffffff060;
  undefined8 in_stack_fffffffffffff068;
  code *pcVar13;
  undefined8 in_stack_fffffffffffff070;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff078;
  pointer in_stack_fffffffffffff088;
  pointer pRVar14;
  pointer in_stack_fffffffffffff090;
  pointer pRVar15;
  pointer in_stack_fffffffffffff098;
  pointer pRVar16;
  _Vector_impl_data in_stack_fffffffffffff0a0;
  pointer in_stack_fffffffffffff0b8;
  pointer pRVar17;
  pointer in_stack_fffffffffffff0c0;
  pointer pRVar18;
  pointer in_stack_fffffffffffff0c8;
  pointer pRVar19;
  undefined8 in_stack_fffffffffffff0d0;
  pointer in_stack_fffffffffffff0d8;
  pointer in_stack_fffffffffffff0e0;
  pointer in_stack_fffffffffffff0e8;
  undefined8 in_stack_fffffffffffff0f0;
  pointer in_stack_fffffffffffff0f8;
  pointer in_stack_fffffffffffff100;
  pointer in_stack_fffffffffffff108;
  undefined1 in_stack_fffffffffffff110 [32];
  RPCResults local_ed0;
  allocator_type local_eb2;
  allocator_type local_eb1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_eb0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_e98;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  ulong *local_d80;
  undefined8 local_d78;
  ulong local_d70;
  undefined8 uStack_d68;
  ulong *local_d60;
  size_type local_d58;
  ulong local_d50;
  undefined8 uStack_d48;
  long *local_d40 [2];
  long local_d30 [2];
  long *local_d20 [2];
  long local_d10 [2];
  RPCResult local_d00;
  long *local_c78 [2];
  long local_c68 [2];
  long *local_c58 [2];
  long local_c48 [2];
  long *local_c38 [2];
  long local_c28 [2];
  long *local_c18 [2];
  long local_c08 [2];
  long *local_bf8 [2];
  long local_be8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_bd8;
  long *local_bb8 [2];
  long local_ba8 [2];
  pointer local_b98 [2];
  undefined1 local_b88 [152];
  RPCResult local_af0;
  RPCResult local_a68;
  RPCResult local_9e0;
  long *local_958 [2];
  long local_948 [2];
  long *local_938 [2];
  long local_928 [2];
  RPCResult local_918;
  undefined1 local_890;
  undefined1 *local_888;
  undefined8 local_880;
  undefined1 local_878;
  undefined7 uStack_877;
  undefined1 local_868 [32];
  long *local_848 [2];
  long local_838 [2];
  UniValue local_828;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7d0;
  undefined1 local_778;
  long *local_770 [2];
  long local_760 [2];
  undefined1 local_750 [8];
  undefined1 *local_748;
  undefined8 local_740;
  undefined1 local_738;
  undefined7 uStack_737;
  undefined1 local_728 [32];
  undefined1 local_708;
  undefined1 *local_700;
  undefined8 local_6f8;
  undefined1 local_6f0;
  undefined7 uStack_6ef;
  undefined1 local_6e0 [32];
  long *local_6c0 [2];
  long local_6b0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_6a0;
  undefined1 local_648;
  long *local_640 [2];
  long local_630 [2];
  RPCArg local_620;
  long *local_518 [2];
  long local_508 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f8;
  undefined1 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  undefined1 local_478;
  vector<RPCArg,_std::allocator<RPCArg>_> local_470;
  undefined1 auStack_458 [8];
  undefined1 local_450 [32];
  long *local_430 [2];
  long local_420 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"createmultisig","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nCreates a multi-signature address with n signature of m keys required.\nIt returns a json object with the address and redeemScript.\n"
             ,"");
  local_3b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_3b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"nrequired","");
  local_410._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_3b8 = 0;
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_430,"The number of required signatures out of the n keys.","");
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_478 = 0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_450._0_8_ = (pointer)0x0;
  local_450._8_2_ = 0;
  local_450._10_6_ = 0;
  local_450._16_2_ = 0;
  local_450._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff04c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff048;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  name.field_2._8_8_ = in_stack_fffffffffffff060;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff070;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff068;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff078;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff088;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff090;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff098;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff0a0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff0a0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff0a0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff0b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff0c0;
  description_06._M_string_length = in_stack_fffffffffffff0d0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0c8;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff0d8;
  description_06.field_2._8_8_ = in_stack_fffffffffffff0e0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0f0;
  opts._0_8_ = in_stack_fffffffffffff0e8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff0f8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff100;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff108;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff110._0_24_;
  opts.hidden = (bool)in_stack_fffffffffffff110[0x18];
  opts.also_positional = (bool)in_stack_fffffffffffff110[0x19];
  opts._66_6_ = in_stack_fffffffffffff110._26_6_;
  RPCArg::RPCArg(&local_390,name,(Type)&local_3b0,fallback,description_06,opts);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"keys","");
  local_4f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_4a0 = 0;
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_518,"The hex-encoded public keys.","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"key","");
  local_6a0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_648 = 0;
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,"The hex-encoded public key","");
  local_700 = &local_6f0;
  local_708 = 0;
  local_6f8 = 0;
  local_6f0 = 0;
  local_6e0._0_8_ = (pointer)0x0;
  local_6e0._8_2_ = 0;
  local_6e0._10_6_ = 0;
  local_6e0._16_2_ = 0;
  local_6e0._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff04c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff048;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  name_00.field_2._8_8_ = in_stack_fffffffffffff060;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff070;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff068;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff078;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff088;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff090;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff098;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff0a0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff0a0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff0a0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff0b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff0c0;
  description_07._M_string_length = in_stack_fffffffffffff0d0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0c8;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff0d8;
  description_07.field_2._8_8_ = in_stack_fffffffffffff0e0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0f0;
  opts_00._0_8_ = in_stack_fffffffffffff0e8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff0f8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff100;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff108;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff110._0_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff110[0x18];
  opts_00.also_positional = (bool)in_stack_fffffffffffff110[0x19];
  opts_00._66_6_ = in_stack_fffffffffffff110._26_6_;
  RPCArg::RPCArg(&local_620,name_00,(Type)local_640,fallback_00,description_07,opts_00);
  __l._M_len = 1;
  __l._M_array = &local_620;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_eb0,__l,&local_eb1);
  local_748 = &local_738;
  local_750[0] = 0;
  local_740 = 0;
  local_738 = 0;
  local_728._0_8_ = (pointer)0x0;
  local_728._8_2_ = 0;
  local_728._10_6_ = 0;
  local_728._16_2_ = 0;
  local_728._18_8_ = 0;
  puVar11 = local_750;
  name_01._M_string_length = (size_type)in_RDI;
  name_01._M_dataplus._M_p = puVar11;
  name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  name_01.field_2._8_8_ = in_stack_fffffffffffff060;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff070;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff068;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff078;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff088;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff090;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff098;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff0a0._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff0a0._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff0a0._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff0b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff0c0;
  description_08._M_string_length = in_stack_fffffffffffff0d0;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0c8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff0d8;
  description_08.field_2._8_8_ = in_stack_fffffffffffff0e0;
  inner_05.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffff0f0;
  inner_05.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffff0e8;
  inner_05.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff0f8;
  RPCArg::RPCArg(&local_288,name_01,(Type)local_498,fallback_01,description_08,inner_05,
                 (RPCArgOptions *)0x1);
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"address_type","");
  UniValue::UniValue<const_char_(&)[7],_char[7],_true>(&local_828,(char (*) [7])0xe31827);
  paVar1 = &local_828.val.field_2;
  local_7d0._8_8_ = (long)&local_7d0 + 0x18;
  local_7d0._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_828.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828.val._M_dataplus._M_p == paVar1) {
    local_7d0._32_8_ = local_828.val.field_2._8_8_;
  }
  else {
    local_7d0._8_8_ = local_828.val._M_dataplus._M_p;
  }
  local_7d0._16_8_ = local_828.val._M_string_length;
  local_828.val._M_string_length = 0;
  local_828.val.field_2._M_local_buf[0] = '\0';
  local_7d0._40_8_ =
       local_828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_7d0._48_8_ =
       local_828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_7d0._56_8_ =
       local_828.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_828.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7d0._64_4_ =
       local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_7d0._68_4_ =
       local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_7d0._72_4_ =
       local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_7d0._76_4_ =
       local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_7d0._80_8_ =
       local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_828.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_778 = 2;
  local_848[0] = local_838;
  local_828.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,
             "The address type to use. Options are \"legacy\", \"p2sh-segwit\", and \"bech32\".","")
  ;
  local_888 = &local_878;
  local_890 = 0;
  local_880 = 0;
  local_878 = 0;
  local_868._0_8_ = (pointer)0x0;
  local_868._8_2_ = 0;
  local_868._10_6_ = 0;
  local_868._16_2_ = 0;
  local_868._18_8_ = 0;
  name_02._M_string_length = (size_type)in_RDI;
  name_02._M_dataplus._M_p = puVar11;
  name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  name_02.field_2._8_8_ = in_stack_fffffffffffff060;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff070;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff068;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff078;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff088;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff090;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff098;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff0a0._M_start;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff0a0._M_finish;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff0a0._M_end_of_storage;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff0b8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff0c0;
  description_09._M_string_length = in_stack_fffffffffffff0d0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0c8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff0d8;
  description_09.field_2._8_8_ = in_stack_fffffffffffff0e0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0f0;
  opts_01._0_8_ = in_stack_fffffffffffff0e8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff0f8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff100;
  opts_01.oneline_description.field_2._8_8_ = in_stack_fffffffffffff108;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff110._0_24_;
  opts_01.hidden = (bool)in_stack_fffffffffffff110[0x18];
  opts_01.also_positional = (bool)in_stack_fffffffffffff110[0x19];
  opts_01._66_6_ = in_stack_fffffffffffff110._26_6_;
  RPCArg::RPCArg(&local_180,name_02,(Type)local_770,fallback_02,description_09,opts_01);
  __l_00._M_len = 3;
  __l_00._M_array = &local_390;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_e98,__l_00,&local_eb2);
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"");
  local_958[0] = local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_958,"");
  local_b98[0] = (pointer)local_b88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"address","");
  local_bb8[0] = local_ba8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bb8,"The value of the new multisig address.","");
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = puVar11;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff060;
  description._M_string_length = in_stack_fffffffffffff070;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description.field_2 = in_stack_fffffffffffff078;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff090;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff088;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff098;
  RPCResult::RPCResult
            ((RPCResult *)(local_b88 + 0x10),STR,m_key_name,description,inner,SUB81(local_b98,0));
  local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd8,"redeemScript","");
  local_bf8[0] = local_be8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bf8,"The string value of the hex-encoded redemption script.","");
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = puVar11;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff060;
  description_00._M_string_length = in_stack_fffffffffffff070;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_00.field_2 = in_stack_fffffffffffff078;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff090;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff088;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff098;
  RPCResult::RPCResult(&local_af0,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(&local_bd8,0))
  ;
  local_c18[0] = local_c08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c18,"descriptor","");
  local_c38[0] = local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"The descriptor for this multisig","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = puVar11;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff060;
  description_01._M_string_length = in_stack_fffffffffffff070;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_01.field_2 = in_stack_fffffffffffff078;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff090;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff088;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff098;
  RPCResult::RPCResult(&local_a68,STR,m_key_name_01,description_01,inner_01,SUB81(local_c18,0));
  local_c58[0] = local_c48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c58,"warnings","");
  local_c78[0] = local_c68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c78,"Any warnings resulting from the creation of this multisig","");
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d20,"");
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = puVar11;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff060;
  description_02._M_string_length = in_stack_fffffffffffff070;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_02.field_2 = in_stack_fffffffffffff078;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d00,STR,m_key_name_02,description_02,inner_02,SUB81(local_d20,0));
  uVar12 = (undefined4)((ulong)puVar11 >> 0x20);
  __l_01._M_len = 1;
  __l_01._M_array = &local_d00;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0a0,__l_01,
             (allocator_type *)&stack0xfffffffffffff087);
  uVar10 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = uVar12;
  auVar4._12_8_ = in_stack_fffffffffffff058;
  auVar4._20_8_ = in_stack_fffffffffffff060;
  auVar4._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff070;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff078._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  RPCResult::RPCResult
            (&local_9e0,ARR,(string)(auVar4 << 0x20),SUB81(local_c58,0),description_03,inner_03,true
            );
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)(local_b88 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff118,__l_02,
             (allocator_type *)&stack0xfffffffffffff086);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar12;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff058;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff060;
  description_04._M_string_length = in_stack_fffffffffffff070;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff068;
  description_04.field_2 = in_stack_fffffffffffff078;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  RPCResult::RPCResult(&local_918,OBJ,m_key_name_03,description_04,inner_04,SUB81(local_938,0));
  result._4_4_ = uVar12;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff058;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff060;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff068;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff070;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff078;
  result._64_8_ = pRVar14;
  result.m_description._M_dataplus._M_p = (pointer)pRVar15;
  result.m_description._M_string_length = (size_type)pRVar16;
  result._88_24_ = in_stack_fffffffffffff0a0;
  result.m_cond._M_string_length = (size_type)pRVar17;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar18;
  result.m_cond.field_2._8_8_ = pRVar19;
  RPCResults::RPCResults(&local_ed0,result);
  local_e00._M_dataplus._M_p = (pointer)&local_e00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e00,"createmultisig","");
  local_e20._M_dataplus._M_p = (pointer)&local_e20.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e20,
             "2 \"[\\\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\\\",\\\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\\\"]\""
             ,"");
  HelpExampleCli(&local_de0,&local_e00,&local_e20);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_de0,0,0,"\nCreate a multisig address from 2 public keys\n",0x2e);
  local_dc0._M_dataplus._M_p = (pointer)&local_dc0.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar1 == paVar7) {
    local_dc0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_dc0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_dc0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_dc0._M_dataplus._M_p = (pointer)paVar1;
  }
  local_dc0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_dc0,"\nAs a JSON-RPC call\n");
  paVar1 = &local_da0.field_2;
  local_da0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p == paVar7) {
    local_da0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_da0.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_da0.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    local_da0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_da0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_da0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_e60._M_dataplus._M_p = (pointer)&local_e60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e60,"createmultisig","");
  local_e80._M_dataplus._M_p = (pointer)&local_e80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e80,
             "2, [\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\",\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\"]"
             ,"");
  HelpExampleRpc(&local_e40,&local_e60,&local_e80);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p != paVar1) {
    uVar8 = local_da0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_e40._M_string_length + local_da0._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e40._M_dataplus._M_p != &local_e40.field_2) {
      uVar8 = local_e40.field_2._M_allocated_capacity;
    }
    if (local_e40._M_string_length + local_da0._M_string_length <= (ulong)uVar8) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_e40,0,0,local_da0._M_dataplus._M_p,local_da0._M_string_length);
      goto LAB_00a59590;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_da0,local_e40._M_dataplus._M_p,local_e40._M_string_length);
LAB_00a59590:
  local_d80 = &local_d70;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar7) {
    local_d70 = paVar7->_M_allocated_capacity;
    uStack_d68 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_d70 = paVar7->_M_allocated_capacity;
    local_d80 = puVar2;
  }
  local_d58 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  if (local_d80 == &local_d70) {
    uStack_d48 = uStack_d68;
    local_d60 = &local_d50;
  }
  else {
    local_d60 = local_d80;
  }
  local_d50 = local_d70;
  local_d78 = 0;
  local_d70 = local_d70 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:119:9)>
            ::_M_manager;
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:119:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:119:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff078;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  examples.m_examples._M_string_length = (size_type)pRVar18;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar17;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar19;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff0d0;
  local_d80 = &local_d70;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff058)),description_05,args,
             (RPCResults)in_stack_fffffffffffff0a0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xfffffffffffff058,&stack0xfffffffffffff058,3);
  }
  if (local_d60 != &local_d50) {
    operator_delete(local_d60,local_d50 + 1);
  }
  if (local_d80 != &local_d70) {
    operator_delete(local_d80,local_d70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e40._M_dataplus._M_p != &local_e40.field_2) {
    operator_delete(local_e40._M_dataplus._M_p,local_e40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._M_dataplus._M_p != &local_e80.field_2) {
    operator_delete(local_e80._M_dataplus._M_p,local_e80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e60._M_dataplus._M_p != &local_e60.field_2) {
    operator_delete(local_e60._M_dataplus._M_p,local_e60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da0._M_dataplus._M_p != paVar1) {
    operator_delete(local_da0._M_dataplus._M_p,local_da0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc0._M_dataplus._M_p != &local_dc0.field_2) {
    operator_delete(local_dc0._M_dataplus._M_p,local_dc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
    operator_delete(local_de0._M_dataplus._M_p,local_de0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e20._M_dataplus._M_p != &local_e20.field_2) {
    operator_delete(local_e20._M_dataplus._M_p,local_e20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e00._M_dataplus._M_p != &local_e00.field_2) {
    operator_delete(local_e00._M_dataplus._M_p,local_e00.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ed0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918.m_cond._M_dataplus._M_p != &local_918.m_cond.field_2) {
    operator_delete(local_918.m_cond._M_dataplus._M_p,
                    local_918.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918.m_description._M_dataplus._M_p != &local_918.m_description.field_2) {
    operator_delete(local_918.m_description._M_dataplus._M_p,
                    local_918.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_918.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918.m_key_name._M_dataplus._M_p != &local_918.m_key_name.field_2) {
    operator_delete(local_918.m_key_name._M_dataplus._M_p,
                    local_918.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff118);
  lVar9 = 0x220;
  do {
    if ((long *)(local_b88 + lVar9) != *(long **)((long)local_b98 + lVar9)) {
      operator_delete(*(long **)((long)local_b98 + lVar9),*(long *)(local_b88 + lVar9) + 1);
    }
    if ((long *)((long)local_ba8 + lVar9) != *(long **)((long)local_bb8 + lVar9)) {
      operator_delete(*(long **)((long)local_bb8 + lVar9),*(long *)((long)local_ba8 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_be8 + lVar9) != *(long **)((long)local_bf8 + lVar9)) {
      operator_delete(*(long **)((long)local_bf8 + lVar9),*(long *)((long)local_be8 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d00.m_cond._M_dataplus._M_p != &local_d00.m_cond.field_2) {
    operator_delete(local_d00.m_cond._M_dataplus._M_p,
                    local_d00.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d00.m_description._M_dataplus._M_p != &local_d00.m_description.field_2) {
    operator_delete(local_d00.m_description._M_dataplus._M_p,
                    local_d00.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d00.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d00.m_key_name._M_dataplus._M_p != &local_d00.m_key_name.field_2) {
    operator_delete(local_d00.m_key_name._M_dataplus._M_p,
                    local_d00.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff088);
  if (local_d40[0] != local_d30) {
    operator_delete(local_d40[0],local_d30[0] + 1);
  }
  if (local_d20[0] != local_d10) {
    operator_delete(local_d20[0],local_d10[0] + 1);
  }
  if (local_c78[0] != local_c68) {
    operator_delete(local_c78[0],local_c68[0] + 1);
  }
  if (local_c58[0] != local_c48) {
    operator_delete(local_c58[0],local_c48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0b8);
  if (local_c38[0] != local_c28) {
    operator_delete(local_c38[0],local_c28[0] + 1);
  }
  if (local_c18[0] != local_c08) {
    operator_delete(local_c18[0],local_c08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0d8);
  if (local_bf8[0] != local_be8) {
    operator_delete(local_bf8[0],local_be8[0] + 1);
  }
  if (local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_bd8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_bd8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0f8);
  if (local_bb8[0] != local_ba8) {
    operator_delete(local_bb8[0],local_ba8[0] + 1);
  }
  if (local_b98[0] != (pointer)local_b88) {
    operator_delete(local_b98[0],local_b88._0_8_ + 1);
  }
  if (local_958[0] != local_948) {
    operator_delete(local_958[0],local_948[0] + 1);
  }
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_e98);
  lVar9 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3b0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar9));
    plVar3 = *(long **)((long)&local_410 + lVar9 + 0x40);
    plVar6 = (long *)((long)&local_410 + lVar9 + 0x50);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_410 + lVar9 + 0x28);
    plVar3 = *(long **)((long)&local_410 + lVar9 + 0x18);
    if (plVar6 != plVar3) {
      operator_delete(plVar3,*plVar6 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_458 + lVar9));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar9
               ));
    if ((long *)((long)local_488 + lVar9) != *(long **)((long)local_498 + lVar9)) {
      operator_delete(*(long **)((long)local_498 + lVar9),*(long *)((long)local_488 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x108;
  } while (lVar9 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_868);
  if (local_888 != &local_878) {
    operator_delete(local_888,CONCAT71(uStack_877,local_878) + 1);
  }
  if (local_848[0] != local_838) {
    operator_delete(local_848[0],local_838[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7d0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_828.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_828.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828.val._M_dataplus._M_p != &local_828.val.field_2) {
    operator_delete(local_828.val._M_dataplus._M_p,
                    CONCAT71(local_828.val.field_2._M_allocated_capacity._1_7_,
                             local_828.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_770[0] != local_760) {
    operator_delete(local_770[0],local_760[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_728);
  if (local_748 != &local_738) {
    operator_delete(local_748,CONCAT71(uStack_737,local_738) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_eb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_620.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_opts.oneline_description._M_dataplus._M_p !=
      &local_620.m_opts.oneline_description.field_2) {
    operator_delete(local_620.m_opts.oneline_description._M_dataplus._M_p,
                    local_620.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_description._M_dataplus._M_p != &local_620.m_description.field_2) {
    operator_delete(local_620.m_description._M_dataplus._M_p,
                    local_620.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_620.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_620.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620.m_names._M_dataplus._M_p != &local_620.m_names.field_2) {
    operator_delete(local_620.m_names._M_dataplus._M_p,
                    local_620.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6e0);
  if (local_700 != &local_6f0) {
    operator_delete(local_700,CONCAT71(uStack_6ef,local_6f0) + 1);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_6a0._M_first);
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f8._M_first);
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  if (local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_470.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  if (local_3b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_3b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_3b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_3b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createmultisig()
{
    return RPCHelpMan{"createmultisig",
        "\nCreates a multi-signature address with n signature of m keys required.\n"
        "It returns a json object with the address and redeemScript.\n",
        {
            {"nrequired", RPCArg::Type::NUM, RPCArg::Optional::NO, "The number of required signatures out of the n keys."},
            {"keys", RPCArg::Type::ARR, RPCArg::Optional::NO, "The hex-encoded public keys.",
                {
                    {"key", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "The hex-encoded public key"},
                }},
            {"address_type", RPCArg::Type::STR, RPCArg::Default{"legacy"}, "The address type to use. Options are \"legacy\", \"p2sh-segwit\", and \"bech32\"."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "address", "The value of the new multisig address."},
                {RPCResult::Type::STR_HEX, "redeemScript", "The string value of the hex-encoded redemption script."},
                {RPCResult::Type::STR, "descriptor", "The descriptor for this multisig"},
                {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Any warnings resulting from the creation of this multisig",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            }
        },
        RPCExamples{
            "\nCreate a multisig address from 2 public keys\n"
            + HelpExampleCli("createmultisig", "2 \"[\\\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\\\",\\\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\\\"]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("createmultisig", "2, [\"03789ed0bb717d88f7d321a368d905e7430207ebbd82bd342cf11ae157a7ace5fd\",\"03dbc6764b8884a92e871274b87583e6d5c2a58819473e17e107ef3f6aa5a61626\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            int required = request.params[0].getInt<int>();

            // Get the public keys
            const UniValue& keys = request.params[1].get_array();
            std::vector<CPubKey> pubkeys;
            for (unsigned int i = 0; i < keys.size(); ++i) {
                pubkeys.push_back(HexToPubKey(keys[i].get_str()));
            }

            // Get the output type
            OutputType output_type = OutputType::LEGACY;
            if (!request.params[2].isNull()) {
                std::optional<OutputType> parsed = ParseOutputType(request.params[2].get_str());
                if (!parsed) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Unknown address type '%s'", request.params[2].get_str()));
                } else if (parsed.value() == OutputType::BECH32M) {
                    throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "createmultisig cannot create bech32m multisig addresses");
                }
                output_type = parsed.value();
            }

            FlatSigningProvider keystore;
            CScript inner;
            const CTxDestination dest = AddAndGetMultisigDestination(required, pubkeys, output_type, keystore, inner);

            // Make the descriptor
            std::unique_ptr<Descriptor> descriptor = InferDescriptor(GetScriptForDestination(dest), keystore);

            UniValue result(UniValue::VOBJ);
            result.pushKV("address", EncodeDestination(dest));
            result.pushKV("redeemScript", HexStr(inner));
            result.pushKV("descriptor", descriptor->ToString());

            UniValue warnings(UniValue::VARR);
            if (descriptor->GetOutputType() != output_type) {
                // Only warns if the user has explicitly chosen an address type we cannot generate
                warnings.push_back("Unable to make chosen address type, please ensure no uncompressed public keys are present.");
            }
            PushWarnings(warnings, result);

            return result;
        },
    };
}